

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O3

INT64 calculate_op(YMF271Chip *chip,int slotnum,INT64 inp)

{
  double dVar1;
  short sVar2;
  UINT32 UVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  UINT64 UVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  
  update_envelope(chip->slots + slotnum);
  uVar8 = chip->slots[slotnum].lfo_phase + chip->slots[slotnum].lfo_step;
  UVar3 = chip->slots[slotnum].fns;
  chip->slots[slotnum].lfo_phase = uVar8;
  bVar12 = chip->slots[slotnum].lfowave;
  uVar8 = uVar8 >> 8 & 0xff;
  iVar4 = chip->lut_alfo[bVar12][uVar8];
  chip->slots[slotnum].lfo_amplitude = iVar4;
  dVar1 = chip->lut_plfo[bVar12][chip->slots[slotnum].pms][uVar8];
  chip->slots[slotnum].lfo_phasemod = dVar1;
  uVar9 = (ulong)chip->slots[slotnum].waveform;
  uVar8 = UVar3 * 2;
  if (uVar9 == 7) {
    dVar14 = (double)(uVar8 | 0x1000) * pow_table[chip->slots[slotnum].block] *
             fs_frequency[chip->slots[slotnum].fs] * multiple_table[chip->slots[slotnum].multiple];
    dVar15 = 0.125;
  }
  else {
    dVar14 = (double)uVar8 * pow_table[chip->slots[slotnum].block] *
             multiple_table[chip->slots[slotnum].multiple] * 1024.0;
    dVar15 = 0.0001220703125;
  }
  uVar10 = (ulong)(dVar1 * dVar14 * dVar15);
  chip->slots[slotnum].step = (UINT32)uVar10;
  bVar12 = chip->slots[slotnum].ams - 1;
  uVar11 = 0x10000;
  if (bVar12 < 3) {
    uVar11 = (ulong)(0x10000 - (iVar4 * *(int *)(&DAT_0017bb80 + (ulong)bVar12 * 4) >> 0x10));
  }
  iVar4 = chip->lut_env_volume[0xff - *(short *)((long)&chip->slots[slotnum].volume + 2)];
  iVar5 = chip->lut_total_level[chip->slots[slotnum].tl];
  if (inp == -2) {
    iVar13 = 0;
  }
  else if (inp == -1) {
    lVar6 = chip->slots[slotnum].feedback_modulation1;
    iVar13 = (int)((chip->slots[slotnum].feedback_modulation0 + lVar6) / 2);
    chip->slots[slotnum].feedback_modulation0 = lVar6;
  }
  else {
    iVar13 = (int)inp * modulation_level[chip->slots[slotnum].feedback] * 0x100;
  }
  UVar7 = chip->slots[slotnum].stepptr;
  sVar2 = *(short *)((long)chip->lut_waves[uVar9] +
                    (ulong)((uint)(iVar13 + (int)UVar7) >> 0xf & 0x7fe));
  chip->slots[slotnum].stepptr = (uVar10 & 0xffffffff) + UVar7;
  return (long)sVar2 * (long)(int)((long)iVar5 * (uVar11 * (long)iVar4 >> 0x10) >> 0x10) >> 0x10;
}

Assistant:

static INT64 calculate_op(YMF271Chip *chip, int slotnum, INT64 inp)
{
	YMF271Slot *slot = &chip->slots[slotnum];
	INT64 env, slot_output, slot_input = 0;

	update_envelope(slot);
	update_lfo(chip, slot);
	env = calculate_slot_volume(chip, slot);

	if (inp == OP_INPUT_FEEDBACK)
	{
		// from own feedback
		slot_input = (slot->feedback_modulation0 + slot->feedback_modulation1) / 2;
		slot->feedback_modulation0 = slot->feedback_modulation1;
	}
	else if (inp != OP_INPUT_NONE)
	{
		// from previous slot output
		slot_input = ((inp << (SIN_BITS-2)) * modulation_level[slot->feedback]);
	}

	slot_output = chip->lut_waves[slot->waveform][((slot->stepptr + slot_input) >> 16) & SIN_MASK];
	slot_output = (slot_output * env) >> 16;
	slot->stepptr += slot->step;

	return slot_output;
}